

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qislamiccivilcalendar.cpp
# Opt level: O3

QStringList * QIslamicCivilCalendar::nameList(void)

{
  Data *pDVar1;
  int *piVar2;
  QString *data;
  QString *pQVar3;
  ulong uVar4;
  QStringList *in_RDI;
  long lVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_88;
  char16_t *local_80 [3];
  long local_68;
  char16_t *local_60;
  qsizetype local_58 [2];
  char16_t *local_48;
  undefined8 local_40;
  undefined8 local_38;
  char16_t *local_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  qVar6 = 0;
  local_80[0] = (char16_t *)0x0;
  local_80[1] = L"Islamic Civil";
  local_80[2] = (char16_t *)0xd;
  local_68 = 0;
  local_60 = L"islamic-civil";
  local_58[0] = 0xd;
  local_58[1] = 0;
  local_48 = L"islamicc";
  local_40 = 8;
  local_38 = 0;
  local_30 = L"Islamic";
  local_28 = 7;
  local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = (QString *)QArrayData::allocate(&local_88,0x18,0x10,4,KeepSize);
  (in_RDI->d).d = (Data *)local_88;
  (in_RDI->d).ptr = pQVar3;
  (in_RDI->d).size = 0;
  uVar4 = 0xffffffffffffffe8;
  do {
    pDVar1 = *(Data **)((long)local_80 + uVar4 + 0x18);
    pQVar3[qVar6].d.d = pDVar1;
    pQVar3[qVar6].d.ptr = *(char16_t **)((long)local_80 + uVar4 + 0x20);
    pQVar3[qVar6].d.size = *(qsizetype *)((long)local_58 + uVar4);
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      qVar6 = (in_RDI->d).size;
    }
    qVar6 = qVar6 + 1;
    (in_RDI->d).size = qVar6;
    uVar4 = uVar4 + 0x18;
  } while (uVar4 < 0x48);
  lVar5 = 0x48;
  do {
    piVar2 = *(int **)((long)local_80 + lVar5);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate(*(QArrayData **)((long)local_80 + lVar5),2,0x10);
      }
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QIslamicCivilCalendar::nameList()
{
    return {
        QStringLiteral("Islamic Civil"),
        QStringLiteral("islamic-civil"), // CLDR name
        QStringLiteral("islamicc"), // old CLDR name, still (2018) used by Mozilla
        // Until we have a concrete implementation that knows all the needed ephemerides:
        QStringLiteral("Islamic"),
    };
}